

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

void Fxch_ManDivDoubleCube(Fxch_Man_t *pFxchMan,int iCube,int fAdd,int fUpdate)

{
  Vec_Int_t *p;
  char fAdd_00;
  char fUpdate_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  uint local_44;
  int iLit1;
  int Lit1;
  int Lit0;
  int iLit0;
  int SubCubeID;
  Vec_Int_t *vCube;
  Vec_Int_t *vLitHashKeys;
  int fUpdate_local;
  int fAdd_local;
  int iCube_local;
  Fxch_Man_t *pFxchMan_local;
  
  p = pFxchMan->vLitHashKeys;
  p_00 = Vec_WecEntry(pFxchMan->vCubes,iCube);
  Lit0 = 0;
  for (Lit1 = 1; iVar1 = Vec_IntSize(p_00), Lit1 < iVar1; Lit1 = Lit1 + 1) {
    iVar1 = Vec_IntEntry(p_00,Lit1);
    iVar1 = Vec_IntEntry(p,iVar1);
    Lit0 = iVar1 + Lit0;
  }
  fAdd_00 = (char)fAdd;
  fUpdate_00 = (char)fUpdate;
  Fxch_ManSCAddRemove(pFxchMan,Lit0,iCube,0,0,fAdd_00,fUpdate_00);
  for (Lit1 = 1; iVar1 = Vec_IntSize(p_00), Lit1 < iVar1; Lit1 = Lit1 + 1) {
    iVar1 = Vec_IntEntry(p_00,Lit1);
    iVar2 = Vec_IntEntry(p,iVar1);
    Lit0 = Lit0 - iVar2;
    iVar2 = Fxch_ManSCAddRemove(pFxchMan,Lit0,iCube,Lit1,0,fAdd_00,fUpdate_00);
    pFxchMan->nPairsD = iVar2 + pFxchMan->nPairsD;
    iVar2 = Vec_IntSize(p_00);
    local_44 = Lit1;
    if (2 < iVar2) {
      while( true ) {
        local_44 = local_44 + 1;
        iVar2 = Vec_IntSize(p_00);
        if (iVar2 <= (int)local_44) break;
        iVar2 = Vec_IntEntry(p_00,local_44);
        iVar3 = Vec_IntEntry(p,iVar2);
        iVar4 = Fxch_ManSCAddRemove(pFxchMan,Lit0 - iVar3,iCube,Lit1,local_44,fAdd_00,fUpdate_00);
        pFxchMan->nPairsD = iVar4 + pFxchMan->nPairsD;
        iVar2 = Vec_IntEntry(p,iVar2);
        Lit0 = iVar2 + (Lit0 - iVar3);
      }
    }
    iVar1 = Vec_IntEntry(p,iVar1);
    Lit0 = iVar1 + Lit0;
  }
  return;
}

Assistant:

static inline void Fxch_ManDivDoubleCube( Fxch_Man_t* pFxchMan,
                                          int iCube,
                                          int fAdd,
                                          int fUpdate )
{
    Vec_Int_t* vLitHashKeys = pFxchMan->vLitHashKeys,
             * vCube = Vec_WecEntry( pFxchMan->vCubes, iCube );
    int SubCubeID = 0,
        iLit0,
        Lit0;

    Vec_IntForEachEntryStart( vCube, Lit0, iLit0, 1)
        SubCubeID += Vec_IntEntry( vLitHashKeys, Lit0 );

    Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                         iCube, 0, 0,
                         (char)fAdd, (char)fUpdate );

    Vec_IntForEachEntryStart( vCube, Lit0, iLit0, 1)
    {
        /* 1 Lit remove */
        SubCubeID -= Vec_IntEntry( vLitHashKeys, Lit0 );

        pFxchMan->nPairsD += Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                                                  iCube, iLit0, 0,
                                                  (char)fAdd, (char)fUpdate );

        if ( Vec_IntSize( vCube ) >= 3 )
        {
            int Lit1,
                iLit1;

            Vec_IntForEachEntryStart( vCube, Lit1, iLit1, iLit0 + 1)
            {
                /* 2 Lit remove */
                SubCubeID -= Vec_IntEntry( vLitHashKeys, Lit1 );

                pFxchMan->nPairsD += Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                                                          iCube, iLit0, iLit1,
                                                          (char)fAdd, (char)fUpdate );

                SubCubeID += Vec_IntEntry( vLitHashKeys, Lit1 );
            }
        }

        SubCubeID += Vec_IntEntry( vLitHashKeys, Lit0 );
    }
}